

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_build_gamma_table(png_structrp png_ptr,int bit_depth)

{
  undefined1 uVar1;
  int iVar2;
  double dVar3;
  uint uVar4;
  png_uint_16pp pppVar5;
  png_uint_16 *ppVar6;
  byte bVar7;
  byte bVar8;
  png_fixed_point pVar9;
  ulong uVar10;
  uint shift;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  if ((png_ptr->gamma_table != (png_bytep)0x0) || (png_ptr->gamma_16_table != (png_uint_16pp)0x0)) {
    png_warning(png_ptr,"gamma table being rebuilt");
    png_destroy_gamma_table(png_ptr);
  }
  if (bit_depth < 9) {
    if (png_ptr->screen_gamma < 1) {
      pVar9 = 100000;
    }
    else {
      iVar12 = (png_ptr->colorspace).gamma;
      if ((iVar12 == 0) ||
         (dVar3 = floor((1e+15 / (double)iVar12) / (double)png_ptr->screen_gamma + 0.5),
         2147483647.0 < dVar3 || dVar3 < -2147483648.0)) {
        pVar9 = 0;
      }
      else {
        pVar9 = (png_fixed_point)dVar3;
      }
    }
    png_build_8bit_table(png_ptr,&png_ptr->gamma_table,pVar9);
    if ((png_ptr->transformations & 0x600080) != 0) {
      dVar3 = floor(10000000000.0 / (double)(png_ptr->colorspace).gamma + 0.5);
      iVar12 = (int)dVar3;
      if (dVar3 < -2147483648.0) {
        iVar12 = 0;
      }
      if (2147483647.0 < dVar3) {
        iVar12 = 0;
      }
      png_build_8bit_table(png_ptr,&png_ptr->gamma_to_1,iVar12);
      if (png_ptr->screen_gamma < 1) {
        pVar9 = (png_ptr->colorspace).gamma;
      }
      else {
        dVar3 = floor(10000000000.0 / (double)png_ptr->screen_gamma + 0.5);
        pVar9 = (int)dVar3;
        if (dVar3 < -2147483648.0) {
          pVar9 = 0;
        }
        if (2147483647.0 < dVar3) {
          pVar9 = 0;
        }
      }
      png_build_8bit_table(png_ptr,&png_ptr->gamma_from_1,pVar9);
      return;
    }
  }
  else {
    if ((png_ptr->color_type & 2) == 0) {
      bVar8 = (png_ptr->sig_bit).gray;
    }
    else {
      uVar1 = (png_ptr->sig_bit).red;
      bVar7 = (png_ptr->sig_bit).green;
      bVar8 = uVar1;
      if ((byte)uVar1 < bVar7) {
        bVar8 = bVar7;
      }
      bVar7 = (png_ptr->sig_bit).blue;
      if (bVar8 < bVar7) {
        bVar8 = bVar7;
      }
    }
    bVar7 = 0x10 - bVar8;
    if (0xe < (byte)(bVar8 - 1)) {
      bVar7 = 0;
    }
    bVar8 = 5;
    if (5 < bVar7) {
      bVar8 = bVar7;
    }
    if ((png_ptr->transformations & 0x4000400) == 0) {
      bVar8 = bVar7;
    }
    bVar7 = 8;
    if (bVar8 < 8) {
      bVar7 = bVar8;
    }
    shift = (uint)bVar7;
    png_ptr->gamma_shift = shift;
    iVar12 = png_ptr->screen_gamma;
    if ((png_ptr->transformations & 0x4000400) == 0) {
      if (iVar12 < 1) {
        pVar9 = 100000;
      }
      else {
        iVar2 = (png_ptr->colorspace).gamma;
        if ((iVar2 == 0) ||
           (dVar3 = floor((1e+15 / (double)iVar2) / (double)iVar12 + 0.5),
           2147483647.0 < dVar3 || dVar3 < -2147483648.0)) {
          pVar9 = 0;
        }
        else {
          pVar9 = (png_fixed_point)dVar3;
        }
      }
      png_build_16bit_table(png_ptr,&png_ptr->gamma_16_table,(uint)bVar7,pVar9);
    }
    else {
      if (iVar12 < 1) {
        uVar15 = 0;
        uVar16 = 0x3ff00000;
      }
      else {
        dVar3 = floor((double)iVar12 * (double)(png_ptr->colorspace).gamma * 1e-05 + 0.5);
        uVar10 = -(ulong)(dVar3 <= 2147483647.0) &
                 -(ulong)(-2147483648.0 <= dVar3) & (ulong)((double)(int)dVar3 * 1e-05);
        uVar15 = (undefined4)uVar10;
        uVar16 = (undefined4)(uVar10 >> 0x20);
      }
      bVar8 = 8 - bVar7;
      uVar10 = (ulong)(uint)(1 << (bVar8 & 0x1f));
      pppVar5 = (png_uint_16pp)png_calloc(png_ptr,uVar10 * 8);
      png_ptr->gamma_16_table = pppVar5;
      uVar13 = 0;
      do {
        ppVar6 = (png_uint_16 *)png_malloc(png_ptr,0x200);
        pppVar5[uVar13] = ppVar6;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      uVar14 = 0xff >> (bVar7 & 0x1f);
      iVar12 = 0;
      uVar11 = 0;
      do {
        dVar3 = pow((double)((iVar12 * 0x101 & 0xffffU) + 0x80) / 65535.0,
                    (double)CONCAT44(uVar16,uVar15));
        dVar3 = floor(dVar3 * 65535.0 + 0.5);
        uVar4 = ((((int)dVar3 & 0xffffU) << (0x10 - bVar7 & 0x1f)) - ((int)dVar3 & 0xffffU)) +
                0x8000;
        if (uVar11 <= uVar4 / 0xffff) {
          do {
            pppVar5[uVar11 & uVar14][uVar11 >> (bVar8 & 0x1f)] = (png_uint_16)(iVar12 * 0x101);
            uVar11 = uVar11 + 1;
          } while (uVar4 / 0xffff + 1 != uVar11);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0xff);
      uVar4 = 0x100 << (bVar8 & 0x1f);
      if (uVar11 < uVar4) {
        do {
          pppVar5[uVar11 & uVar14][uVar11 >> (bVar8 & 0x1f)] = 0xffff;
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
    }
    if ((png_ptr->transformations & 0x600080) != 0) {
      dVar3 = floor(10000000000.0 / (double)(png_ptr->colorspace).gamma + 0.5);
      iVar12 = (int)dVar3;
      if (dVar3 < -2147483648.0) {
        iVar12 = 0;
      }
      if (2147483647.0 < dVar3) {
        iVar12 = 0;
      }
      png_build_16bit_table(png_ptr,&png_ptr->gamma_16_to_1,shift,iVar12);
      if (png_ptr->screen_gamma < 1) {
        pVar9 = (png_ptr->colorspace).gamma;
      }
      else {
        dVar3 = floor(10000000000.0 / (double)png_ptr->screen_gamma + 0.5);
        pVar9 = (int)dVar3;
        if (dVar3 < -2147483648.0) {
          pVar9 = 0;
        }
        if (2147483647.0 < dVar3) {
          pVar9 = 0;
        }
      }
      png_build_16bit_table(png_ptr,&png_ptr->gamma_16_from_1,shift,pVar9);
      return;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_build_gamma_table(png_structrp png_ptr, int bit_depth)
{
   png_debug(1, "in png_build_gamma_table");

   /* Remove any existing table; this copes with multiple calls to
    * png_read_update_info. The warning is because building the gamma tables
    * multiple times is a performance hit - it's harmless but the ability to
    * call png_read_update_info() multiple times is new in 1.5.6 so it seems
    * sensible to warn if the app introduces such a hit.
    */
   if (png_ptr->gamma_table != NULL || png_ptr->gamma_16_table != NULL)
   {
      png_warning(png_ptr, "gamma table being rebuilt");
      png_destroy_gamma_table(png_ptr);
   }

   if (bit_depth <= 8)
   {
      png_build_8bit_table(png_ptr, &png_ptr->gamma_table,
          png_ptr->screen_gamma > 0 ?
          png_reciprocal2(png_ptr->colorspace.gamma,
          png_ptr->screen_gamma) : PNG_FP_1);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) || \
   defined(PNG_READ_ALPHA_MODE_SUPPORTED) || \
   defined(PNG_READ_RGB_TO_GRAY_SUPPORTED)
      if ((png_ptr->transformations & (PNG_COMPOSE | PNG_RGB_TO_GRAY)) != 0)
      {
         png_build_8bit_table(png_ptr, &png_ptr->gamma_to_1,
             png_reciprocal(png_ptr->colorspace.gamma));

         png_build_8bit_table(png_ptr, &png_ptr->gamma_from_1,
             png_ptr->screen_gamma > 0 ?
             png_reciprocal(png_ptr->screen_gamma) :
             png_ptr->colorspace.gamma/* Probably doing rgb_to_gray */);
      }
#endif /* READ_BACKGROUND || READ_ALPHA_MODE || RGB_TO_GRAY */
   }
#ifdef PNG_16BIT_SUPPORTED
   else
   {
      png_byte shift, sig_bit;

      if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      {
         sig_bit = png_ptr->sig_bit.red;

         if (png_ptr->sig_bit.green > sig_bit)
            sig_bit = png_ptr->sig_bit.green;

         if (png_ptr->sig_bit.blue > sig_bit)
            sig_bit = png_ptr->sig_bit.blue;
      }
      else
         sig_bit = png_ptr->sig_bit.gray;

      /* 16-bit gamma code uses this equation:
       *
       *   ov = table[(iv & 0xff) >> gamma_shift][iv >> 8]
       *
       * Where 'iv' is the input color value and 'ov' is the output value -
       * pow(iv, gamma).
       *
       * Thus the gamma table consists of up to 256 256-entry tables.  The table
       * is selected by the (8-gamma_shift) most significant of the low 8 bits
       * of the color value then indexed by the upper 8 bits:
       *
       *   table[low bits][high 8 bits]
       *
       * So the table 'n' corresponds to all those 'iv' of:
       *
       *   <all high 8-bit values><n << gamma_shift>..<(n+1 << gamma_shift)-1>
       *
       */
      if (sig_bit > 0 && sig_bit < 16U)
         /* shift == insignificant bits */
         shift = (png_byte)((16U - sig_bit) & 0xff);

      else
         shift = 0; /* keep all 16 bits */

      if ((png_ptr->transformations & (PNG_16_TO_8 | PNG_SCALE_16_TO_8)) != 0)
      {
         /* PNG_MAX_GAMMA_8 is the number of bits to keep - effectively
          * the significant bits in the *input* when the output will
          * eventually be 8 bits.  By default it is 11.
          */
         if (shift < (16U - PNG_MAX_GAMMA_8))
            shift = (16U - PNG_MAX_GAMMA_8);
      }

      if (shift > 8U)
         shift = 8U; /* Guarantees at least one table! */

      png_ptr->gamma_shift = shift;

      /* NOTE: prior to 1.5.4 this test used to include PNG_BACKGROUND (now
       * PNG_COMPOSE).  This effectively smashed the background calculation for
       * 16-bit output because the 8-bit table assumes the result will be
       * reduced to 8 bits.
       */
      if ((png_ptr->transformations & (PNG_16_TO_8 | PNG_SCALE_16_TO_8)) != 0)
          png_build_16to8_table(png_ptr, &png_ptr->gamma_16_table, shift,
          png_ptr->screen_gamma > 0 ? png_product2(png_ptr->colorspace.gamma,
          png_ptr->screen_gamma) : PNG_FP_1);

      else
          png_build_16bit_table(png_ptr, &png_ptr->gamma_16_table, shift,
          png_ptr->screen_gamma > 0 ? png_reciprocal2(png_ptr->colorspace.gamma,
          png_ptr->screen_gamma) : PNG_FP_1);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) || \
   defined(PNG_READ_ALPHA_MODE_SUPPORTED) || \
   defined(PNG_READ_RGB_TO_GRAY_SUPPORTED)
      if ((png_ptr->transformations & (PNG_COMPOSE | PNG_RGB_TO_GRAY)) != 0)
      {
         png_build_16bit_table(png_ptr, &png_ptr->gamma_16_to_1, shift,
             png_reciprocal(png_ptr->colorspace.gamma));

         /* Notice that the '16 from 1' table should be full precision, however
          * the lookup on this table still uses gamma_shift, so it can't be.
          * TODO: fix this.
          */
         png_build_16bit_table(png_ptr, &png_ptr->gamma_16_from_1, shift,
             png_ptr->screen_gamma > 0 ? png_reciprocal(png_ptr->screen_gamma) :
             png_ptr->colorspace.gamma/* Probably doing rgb_to_gray */);
      }
#endif /* READ_BACKGROUND || READ_ALPHA_MODE || RGB_TO_GRAY */
   }
#endif /* 16BIT */
}